

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_avx2.c
# Opt level: O2

void aom_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int i;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  __m256i *threshold;
  __m256i *qcoeff;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  __m128i mask;
  __m128i mask_00;
  int is_found0;
  __m256i mask0;
  int local_220;
  uint local_21c;
  uint local_218 [2];
  int16_t *local_210;
  intptr_t local_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  __m256i local_1a0;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  __m256i local_140;
  longlong local_120;
  longlong lStack_118;
  longlong lStack_110;
  longlong lStack_108;
  __m256i local_100;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  __m256i local_a0 [3];
  
  local_220 = 0;
  local_120 = 0;
  lStack_118 = 0;
  lStack_110 = 0;
  lStack_108 = 0;
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    local_218[lVar8] = (zbin_ptr[lVar8] * 0x20 + (dequant_ptr[lVar8] * 0x145 + 0x40 >> 7)) - 1;
  }
  auVar13._4_4_ = local_218[1];
  auVar13._0_4_ = local_218[1];
  auVar13._8_4_ = local_218[1];
  auVar13._12_4_ = local_218[1];
  auVar13._16_4_ = local_218[1];
  auVar13._20_4_ = local_218[1];
  auVar13._24_4_ = local_218[1];
  auVar13._28_4_ = local_218[1];
  threshold = local_a0;
  local_a0[0] = (__m256i)vpblendd_avx2(auVar13,ZEXT432(local_218[0]),1);
  auVar12 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
  local_c0 = vpaddw_avx2(auVar12,auVar13);
  local_180 = ZEXT1632(*(undefined1 (*) [16])round_ptr);
  local_160 = ZEXT1632(*(undefined1 (*) [16])quant_ptr);
  local_140 = (__m256i)ZEXT1632(*(undefined1 (*) [16])dequant_ptr);
  local_1c0 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  local_200 = ZEXT1632(*(undefined1 (*) [16])quant_shift_ptr);
  local_1a0 = (__m256i)vpabsw_avx2(local_1c0);
  qcoeff = &local_100;
  local_208 = n_coeffs;
  local_100 = local_1a0;
  update_mask0_avx2(qcoeff,threshold,iscan,&local_220,(__m256i *)&local_120);
  auVar13 = vpcmpgtw_avx2((undefined1  [32])local_1a0,local_c0);
  uVar5 = (uint)(SUB321(auVar13 >> 7,0) & 1) | (uint)(SUB321(auVar13 >> 0xf,0) & 1) << 1 |
          (uint)(SUB321(auVar13 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar13 >> 0x1f,0) & 1) << 3 |
          (uint)(SUB321(auVar13 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar13 >> 0x2f,0) & 1) << 5 |
          (uint)(SUB321(auVar13 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar13 >> 0x3f,0) & 1) << 7 |
          (uint)(SUB321(auVar13 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar13 >> 0x4f,0) & 1) << 9 |
          (uint)(SUB321(auVar13 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar13 >> 0x5f,0) & 1) << 0xb
          | (uint)(SUB321(auVar13 >> 0x67,0) & 1) << 0xc |
          (uint)(SUB321(auVar13 >> 0x6f,0) & 1) << 0xd |
          (uint)(SUB321(auVar13 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar13 >> 0x7f,0) << 0xf |
          (uint)(SUB321(auVar13 >> 0x87,0) & 1) << 0x10 |
          (uint)(SUB321(auVar13 >> 0x8f,0) & 1) << 0x11 |
          (uint)(SUB321(auVar13 >> 0x97,0) & 1) << 0x12 |
          (uint)(SUB321(auVar13 >> 0x9f,0) & 1) << 0x13 |
          (uint)(SUB321(auVar13 >> 0xa7,0) & 1) << 0x14 |
          (uint)(SUB321(auVar13 >> 0xaf,0) & 1) << 0x15 |
          (uint)(SUB321(auVar13 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar13 >> 0xbf,0) << 0x17 |
          (uint)(SUB321(auVar13 >> 199,0) & 1) << 0x18 |
          (uint)(SUB321(auVar13 >> 0xcf,0) & 1) << 0x19 |
          (uint)(SUB321(auVar13 >> 0xd7,0) & 1) << 0x1a |
          (uint)(SUB321(auVar13 >> 0xdf,0) & 1) << 0x1b |
          (uint)(SUB321(auVar13 >> 0xe7,0) & 1) << 0x1c |
          (uint)(SUB321(auVar13 >> 0xef,0) & 1) << 0x1d |
          (uint)(SUB321(auVar13 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar13[0x1f] >> 7) << 0x1f;
  local_21c = CONCAT31((int3)(uVar5 >> 8),uVar5 == 0);
  if (uVar5 == 0) {
    local_1a0 = (__m256i)vpermpd_avx2(local_180,0x55);
    local_e0 = vpermpd_avx2(local_160,0x55);
    local_200 = vpermpd_avx2(local_200,0x55);
    local_1c0 = vpermq_avx2((undefined1  [32])local_140,0x55);
    auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar15 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar12 = vpermq_avx2(auVar13,0xd8);
    auVar12 = vpand_avx2(auVar12,*(undefined1 (*) [32])iscan);
    auVar12 = vpmaxsw_avx2(auVar12,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar17 = ZEXT3264(auVar12);
    auVar12 = vpermq_avx2(local_180,0x54);
    auVar12 = vpaddsw_avx2((undefined1  [32])local_1a0,auVar12);
    auVar14 = vpermq_avx2(local_160,0x54);
    auVar14 = vpmulhw_avx2(auVar12,auVar14);
    auVar12 = vpaddw_avx2(auVar14,auVar12);
    auVar14 = vpermq_avx2(local_200,0x54);
    auVar12 = vpmulhw_avx2(auVar12,auVar14);
    local_1a0 = (__m256i)vpermq_avx2(local_180,0x55);
    local_e0 = vpermq_avx2(local_160,0x55);
    local_200 = vpermq_avx2(local_200,0x55);
    auVar12 = vpsignw_avx2(auVar12,local_1c0);
    auVar12 = vpand_avx2(auVar13,auVar12);
    auVar13 = vpsraw_avx2(auVar12,0xf);
    auVar14 = vpunpcklwd_avx2(auVar12,auVar13);
    auVar13 = vpunpckhwd_avx2(auVar12,auVar13);
    auVar15 = vpermq_avx2((undefined1  [32])local_140,0x54);
    auVar12 = vpmullw_avx2(auVar12,auVar15);
    local_1c0 = vpermq_avx2((undefined1  [32])local_140,0x55);
    auVar16 = vpsraw_avx2(auVar12,0xf);
    auVar15 = vpunpcklwd_avx2(auVar12,auVar16);
    auVar12 = vpunpckhwd_avx2(auVar12,auVar16);
  }
  local_160 = vpermq_avx2(local_c0,0x55);
  *(undefined1 (*) [32])qcoeff_ptr = auVar14;
  *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar13;
  *(undefined1 (*) [32])dqcoeff_ptr = auVar15;
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar12;
  lVar8 = 0x10;
  local_210 = zbin_ptr;
LAB_0030ba9f:
  lVar11 = (long)(int)lVar8 * 2;
  lVar2 = (long)(int)lVar8;
  while( true ) {
    lVar8 = lVar2 + 0x10;
    local_1e0 = auVar17._0_32_;
    if (local_208 <= lVar2) break;
    local_180 = vpackssdw_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar2),
                               *(undefined1 (*) [32])(coeff_ptr + lVar2 + 8));
    local_140 = (__m256i)vpabsw_avx2(local_180);
    qcoeff = &local_100;
    threshold = local_a0;
    local_100 = local_140;
    update_mask0_avx2(qcoeff,threshold,(int16_t *)((long)iscan + lVar11),&local_220,
                      (__m256i *)&local_120);
    auVar13 = vpcmpgtw_avx2((undefined1  [32])local_140,local_160);
    if ((((((((((((((((((((((((((((((((auVar13 >> 7 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar13 >> 0xf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar13 >> 0x17 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar13 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar13 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar13 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar13 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar13 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar13 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar13 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar13 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar13 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0x7f,0) != '\0') ||
                      (auVar13 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar13 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar13 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar13 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar13 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar13 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar13 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar13 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    goto LAB_0030bb6f;
    auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar13 = vpmaxsw_avx2(local_1e0,auVar12);
    auVar17 = ZEXT3264(auVar13);
    *(undefined1 (*) [32])(qcoeff_ptr + lVar2 + 8) = auVar12;
    *(undefined1 (*) [32])(qcoeff_ptr + lVar2) = auVar12;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar2 + 8) = auVar12;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar2) = auVar12;
    lVar11 = lVar11 + 0x20;
    lVar2 = lVar8;
  }
  if (local_220 == 0) {
    uVar5 = 0;
  }
  else {
    auVar3._8_8_ = lStack_118;
    auVar3._0_8_ = local_120;
    auVar4._8_8_ = lStack_108;
    auVar4._0_8_ = lStack_110;
    vpmaxsw_avx(auVar3,auVar4);
    mask[1] = (longlong)threshold;
    mask[0] = (longlong)qcoeff;
    uVar5 = calculate_non_zero_count(mask);
  }
  if ((local_21c & 1) == 0) {
    vpmaxsw_avx(local_1e0._0_16_,local_1e0._16_16_);
    mask_00[1] = (longlong)threshold;
    mask_00[0] = (longlong)qcoeff;
    iVar6 = calculate_non_zero_count(mask_00);
    uVar7 = iVar6 - 1;
  }
  else {
    uVar7 = 0xffffffff;
  }
  for (; (int)uVar5 <= (int)uVar7; uVar7 = uVar7 - 1) {
    sVar1 = scan[uVar7];
    qcoeff_ptr[sVar1] = 0;
    dqcoeff_ptr[sVar1] = 0;
  }
  uVar7 = uVar5 + 1;
  uVar10 = (ulong)uVar5;
  do {
    if ((long)uVar10 < 1) {
      uVar7 = 0;
      break;
    }
    lVar8 = uVar10 - 1;
    uVar10 = uVar10 - 1;
    uVar7 = uVar7 - 1;
  } while (qcoeff_ptr[scan[lVar8]] == 0);
  *eob_ptr = (uint16_t)uVar7;
  uVar10 = 0;
  uVar9 = 0xffffffff;
  do {
    if (uVar5 == uVar10) {
LAB_0030bcc6:
      if (((uint16_t)uVar7 != 0) && (uVar9 == (uVar7 & 0xffff) - 1)) {
        sVar1 = scan[uVar9];
        if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
           (uVar5 = coeff_ptr[sVar1] >> 0x1f, uVar10 = (ulong)((uint)(sVar1 != 0) * 2),
           (int)((coeff_ptr[sVar1] << 5 ^ uVar5) - uVar5) <
           *(short *)((long)local_210 + uVar10) * 0x20 +
           (*(short *)((long)dequant_ptr + uVar10) * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar1] = 0;
          dqcoeff_ptr[sVar1] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar10]] != 0) {
      uVar9 = (uint)uVar10;
      goto LAB_0030bcc6;
    }
    uVar10 = uVar10 + 1;
  } while( true );
LAB_0030bb6f:
  auVar12 = vpermq_avx2(auVar13,0xd8);
  auVar12 = vpand_avx2(auVar12,*(undefined1 (*) [32])(iscan + lVar2));
  auVar12 = vpmaxsw_avx2(auVar12,local_1e0);
  auVar17 = ZEXT3264(auVar12);
  auVar12 = vpaddsw_avx2((undefined1  [32])local_140,(undefined1  [32])local_1a0);
  auVar14 = vpmulhw_avx2(auVar12,local_e0);
  auVar12 = vpaddw_avx2(auVar14,auVar12);
  auVar12 = vpmulhw_avx2(auVar12,local_200);
  auVar12 = vpsignw_avx2(auVar12,local_180);
  local_100 = (__m256i)vpand_avx2(auVar13,auVar12);
  auVar13 = vpsraw_avx2((undefined1  [32])local_100,0xf);
  auVar12 = vpunpcklwd_avx2((undefined1  [32])local_100,auVar13);
  auVar13 = vpunpckhwd_avx2((undefined1  [32])local_100,auVar13);
  *(undefined1 (*) [32])(qcoeff_ptr + lVar2) = auVar12;
  *(undefined1 (*) [32])(qcoeff_ptr + lVar2 + 8) = auVar13;
  auVar13 = vpmullw_avx2((undefined1  [32])local_100,local_1c0);
  auVar14 = vpsraw_avx2(auVar13,0xf);
  auVar12 = vpunpcklwd_avx2(auVar13,auVar14);
  auVar13 = vpunpckhwd_avx2(auVar13,auVar14);
  *(undefined1 (*) [32])(dqcoeff_ptr + lVar2) = auVar12;
  *(undefined1 (*) [32])(dqcoeff_ptr + lVar2 + 8) = auVar13;
  local_21c = 0;
  goto LAB_0030ba9f;
}

Assistant:

void aom_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff, qcoeff;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                     dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff = load_coefficients_avx2(coeff_ptr);
  qcoeff = _mm256_abs_epi16(coeff);
  update_mask0_avx2(&qcoeff, threshold, iscan, &is_found0, &mask0);
  __m256i temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
  update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    // Reinsert signs
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    // Mask out zbin threshold coeffs
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff = load_coefficients_avx2(coeff_ptr + index);
    qcoeff = _mm256_abs_epi16(coeff);
    update_mask0_avx2(&qcoeff, threshold, iscan + index, &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
    cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
    update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr + index);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff0 = qcoeff_ptr[rc];
    if (qcoeff0) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff0 = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff0);
      const int abs_coeff = (coeff0 ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}